

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_functions.hpp
# Opt level: O2

void test_angular_quadrature<IntegratorXX::LebedevLaikov<double>>
               (string *msg,LebedevLaikov<double> *quad,int maxL,double e)

{
  int local_154;
  int local_150;
  int local_14c;
  LebedevLaikov<double> *local_148;
  double local_140;
  string *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> loc_msg;
  
  local_14c = maxL;
  local_148 = quad;
  local_140 = e;
  local_138 = msg;
  for (local_150 = 1; local_150 < local_14c; local_150 = local_150 + 1) {
    local_154 = 0;
    while( true ) {
      if (local_150 < local_154) break;
      std::operator+(&local_b0,local_138,"(L,M) = (");
      std::__cxx11::to_string(&local_d0,local_150);
      std::operator+(&local_90,&local_b0,&local_d0);
      std::operator+(&local_130,&local_90,",");
      std::__cxx11::to_string(&local_110,local_154);
      std::operator+(&local_70,&local_130,&local_110);
      std::operator+(&loc_msg,&local_70,")");
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string((string *)&local_f0,(string *)&loc_msg);
      test_quadrature<MagnitudeSquaredSphericalHarmonic,IntegratorXX::LebedevLaikov<double>,int&,int&>
                (&local_f0,local_148,1.0,local_140,&local_150,&local_154);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&loc_msg);
      local_154 = local_154 + 1;
    }
  }
  return;
}

Assistant:

void test_angular_quadrature(std::string msg, const QuadType& quad, int maxL, double e) {

  for( auto l = 1; l < maxL; ++l )
  for( auto m = 0; m <= l; ++m ) {
    auto loc_msg = msg + "(L,M) = (" + std::to_string(l) + "," + std::to_string(m) + ")";
    test_quadrature<MagnitudeSquaredSphericalHarmonic>(loc_msg, quad, 1.0, e, l, m); 
  }

}